

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::CumulativeReporterBase::testRunEnded(CumulativeReporterBase *this,TestRunStats *testRunStats)

{
  unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>
  ptr;
  Node<Catch::TestRunStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  *in_RAX;
  unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>
  local_18;
  
  local_18.m_ptr = in_RAX;
  Detail::
  make_unique<Catch::CumulativeReporterBase::Node<Catch::TestRunStats,Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,Catch::CumulativeReporterBase::SectionNode>>,Catch::TestRunStats_const&>
            ((Detail *)&local_18,testRunStats);
  ptr.m_ptr = local_18.m_ptr;
  local_18.m_ptr =
       (Node<Catch::TestRunStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
        *)0x0;
  Detail::
  unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>
  ::reset(&this->m_testRun,ptr.m_ptr);
  Detail::
  unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>
  ::~unique_ptr(&local_18);
  std::
  _Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&((this->m_testRun).m_ptr)->children,
             (_Vector_impl_data *)&this->m_testCases);
  (*(this->super_ReporterBase).super_IEventListener._vptr_IEventListener[0x18])(this);
  return;
}

Assistant:

void CumulativeReporterBase::testRunEnded( TestRunStats const& testRunStats ) {
        assert(!m_testRun && "CumulativeReporterBase assumes there can only be one test run");
        m_testRun = Detail::make_unique<TestRunNode>( testRunStats );
        m_testRun->children.swap( m_testCases );
        testRunEndedCumulative();
    }